

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

int SSL_set1_verify_cert_store(SSL *ssl,X509_STORE *store)

{
  SSL_CONFIG *pSVar1;
  __uniq_ptr_data<bssl::CERT,_bssl::internal::Deleter,_true,_true> _Var2;
  int iVar3;
  
  if ((ssl != (SSL *)0x0) &&
     (((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method !=
      (SSL_X509_METHOD *)bssl::ssl_crypto_x509_method)) {
    __assert_fail("ssl == NULL || ssl->ctx->x509_method == &ssl_crypto_x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x26,"void bssl::check_ssl_x509_method(const SSL *)");
  }
  pSVar1 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
  if (pSVar1 == (SSL_CONFIG *)0x0) {
    iVar3 = 0;
  }
  else {
    _Var2.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl =
         (pSVar1->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>;
    X509_STORE_free(*(X509_STORE **)
                     ((long)_Var2.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl + 0x50));
    *(X509_STORE **)
     ((long)_Var2.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl + 0x50) = store;
    iVar3 = 1;
    if (store != (X509_STORE *)0x0) {
      X509_STORE_up_ref(store);
    }
  }
  return iVar3;
}

Assistant:

int SSL_set1_verify_cert_store(SSL *ssl, X509_STORE *store) {
  check_ssl_x509_method(ssl);
  if (!ssl->config) {
    return 0;
  }
  return set_cert_store(&ssl->config->cert->verify_store, store, 1);
}